

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ConfigureStreamingOutput(UnitTestImpl *this)

{
  ulong uVar1;
  TestEventListeners *listener;
  TestEventListeners *this_00;
  undefined8 uVar2;
  UnitTestImpl *in_RDI;
  size_t pos;
  string *target;
  string local_68 [8];
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  StreamingListener *in_stack_ffffffffffffffb0;
  string local_38 [32];
  long local_18;
  undefined1 *local_10;
  
  local_10 = FLAGS_gtest_stream_result_to_abi_cxx11_;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_18 = std::__cxx11::string::find(-0x80,0x3a);
    if (local_18 == -1) {
      uVar2 = std::__cxx11::string::c_str();
      printf("WARNING: unrecognized streaming target \"%s\" ignored.\n",uVar2);
      fflush(_stdout);
    }
    else {
      listener = listeners(in_RDI);
      this_00 = (TestEventListeners *)operator_new(0x10);
      std::__cxx11::string::substr((ulong)local_38,0x1c4880);
      std::__cxx11::string::substr((ulong)local_68,0x1c4880);
      StreamingListener::StreamingListener
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      TestEventListeners::Append(this_00,(TestEventListener *)listener);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_38);
    }
  }
  return;
}

Assistant:

void UnitTestImpl::ConfigureStreamingOutput() {
  const std::string& target = GTEST_FLAG(stream_result_to);
  if (!target.empty()) {
    const size_t pos = target.find(':');
    if (pos != std::string::npos) {
      listeners()->Append(new StreamingListener(target.substr(0, pos),
                                                target.substr(pos+1)));
    } else {
      printf("WARNING: unrecognized streaming target \"%s\" ignored.\n",
             target.c_str());
      fflush(stdout);
    }
  }
}